

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

Diagnostics * __thiscall slang::ast::Compilation::getAllDiagnostics(Compilation *this)

{
  bool bVar1;
  SmallVectorBase<slang::Diagnostic> *pSVar2;
  Diagnostics *pDVar3;
  Compilation *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->cachedAllDiagnostics);
  if (bVar1) {
    this_local = (Compilation *)
                 std::optional<slang::Diagnostics>::operator*(&this->cachedAllDiagnostics);
  }
  else {
    std::optional<slang::Diagnostics>::emplace<>(&this->cachedAllDiagnostics);
    pSVar2 = (SmallVectorBase<slang::Diagnostic> *)
             std::optional<slang::Diagnostics>::operator->(&this->cachedAllDiagnostics);
    pDVar3 = getParseDiagnostics(this);
    SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostics>(pSVar2,pDVar3);
    pSVar2 = (SmallVectorBase<slang::Diagnostic> *)
             std::optional<slang::Diagnostics>::operator->(&this->cachedAllDiagnostics);
    pDVar3 = getSemanticDiagnostics(this);
    SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostics>(pSVar2,pDVar3);
    if (this->sourceManager != (SourceManager *)0x0) {
      pDVar3 = std::optional<slang::Diagnostics>::operator->(&this->cachedAllDiagnostics);
      Diagnostics::sort(pDVar3,this->sourceManager);
    }
    this_local = (Compilation *)
                 std::optional<slang::Diagnostics>::operator*(&this->cachedAllDiagnostics);
  }
  return (Diagnostics *)this_local;
}

Assistant:

const Diagnostics& Compilation::getAllDiagnostics() {
    if (cachedAllDiagnostics)
        return *cachedAllDiagnostics;

    cachedAllDiagnostics.emplace();
    cachedAllDiagnostics->append(getParseDiagnostics());
    cachedAllDiagnostics->append(getSemanticDiagnostics());

    if (sourceManager)
        cachedAllDiagnostics->sort(*sourceManager);
    return *cachedAllDiagnostics;
}